

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGhsMultiGenerator::AddCheckTarget(cmGlobalGhsMultiGenerator *this)

{
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> this_00;
  pointer puVar1;
  cmMakefile *pcVar2;
  cmake *this_01;
  pointer pcVar3;
  long lVar4;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  string *psVar11;
  long *plVar12;
  ulong uVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_> this_02;
  cmSourceFile *this_03;
  size_type *psVar14;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *gen;
  pointer puVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  __single_object cc;
  string argS;
  string argB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  __single_object ptr;
  cmCustomCommandLines commandLines;
  ostringstream msg;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_2c0;
  string local_2b8;
  undefined1 local_298 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined8 local_268;
  undefined1 local_260 [32];
  cmTarget *local_240;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_238;
  __uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_230;
  __uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_228;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_220;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  string local_1f8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  pointer local_188;
  element_type *local_180;
  pointer local_178;
  pointer local_170;
  pointer local_168;
  pointer local_160;
  ios_base local_138 [264];
  
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_SUPPRESS_REGENERATION","");
  bVar8 = cmGlobalGenerator::GlobalSettingIsOn(&this->super_cmGlobalGenerator,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  if (!bVar8) {
    this_00._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
    super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
         (((this->super_cmGlobalGenerator).LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/CMakeFiles/","");
    plVar12 = (long *)std::__cxx11::string::replace
                                ((ulong)local_298,0,(char *)0x0,(ulong)(psVar11->_M_dataplus)._M_p);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    psVar14 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_2b8.field_2._M_allocated_capacity = *psVar14;
      local_2b8.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar14;
      local_2b8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_2b8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    psVar14 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar14) {
      local_198._0_8_ = *psVar14;
      local_198._8_8_ = plVar12[3];
      local_1a8._0_8_ = local_198;
    }
    else {
      local_198._0_8_ = *psVar14;
      local_1a8._0_8_ = (size_type *)*plVar12;
    }
    local_1a8._8_8_ = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_200 = &this->StampFile;
    std::__cxx11::string::operator=((string *)local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_298._0_8_ != (element_type *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    local_278._M_allocated_capacity = 0;
    local_278._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_268 = 0;
    puVar15 = (this->super_cmGlobalGenerator).LocalGenerators.
              super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->super_cmGlobalGenerator).LocalGenerators.
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 != puVar1) {
      do {
        pcVar2 = ((puVar15->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                  .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                   local_278._8_8_,
                   *(undefined8 *)
                    &(pcVar2->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl,
                   (pcVar2->ListFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar1);
    }
    psVar11 = cmake::GetHomeOutputDirectory_abi_cxx11_
                        ((this->super_cmGlobalGenerator).CMakeInstance);
    local_1a8._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_1a8._0_8_ = psVar11->_M_string_length;
    local_198._0_8_ = 0xf;
    local_198._8_8_ = "/CMakeCache.txt";
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_(&local_2b8,views);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_278._M_local_buf,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    bVar9 = cmake::DoWriteGlobVerifyTarget((this->super_cmGlobalGenerator).CMakeInstance);
    if (bVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by gbuild."
                 ,0x6b);
      this_01 = (this->super_cmGlobalGenerator).CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_298._0_8_ = (element_type *)0x0;
      local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_298);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_2b8,(cmListFileBacktrace *)local_298);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    uVar7 = local_278._8_8_;
    uVar6 = local_278._M_allocated_capacity;
    if (local_278._M_allocated_capacity != local_278._8_8_) {
      uVar13 = (long)(local_278._8_8_ - local_278._0_8_) >> 5;
      lVar4 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                (local_278._M_allocated_capacity,local_278._8_8_,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                (uVar6,uVar7);
    }
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_278._M_allocated_capacity,local_278._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_278,(iterator)__first._M_current,(iterator)local_278._8_8_);
    local_218.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_1a8._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_1a8._0_8_ = psVar11->_M_string_length;
    local_198._0_8_ = 2;
    local_198._8_8_ = "-E";
    local_188 = (pointer)&DAT_00000002;
    local_180 = (element_type *)0x761032;
    local_178 = (pointer)&DAT_00000002;
    local_170 = (pointer)0x71828d;
    local_160 = (pointer)(this->StampFile)._M_dataplus._M_p;
    local_168 = (pointer)(this->StampFile)._M_string_length;
    ilist._M_len = 5;
    ilist._M_array = (iterator)local_1a8;
    cmMakeCommandLine((cmCustomCommandLine *)&local_2b8,ilist);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>(&local_218,(cmCustomCommandLine *)&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2b8);
    psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                        ((cmLocalGenerator *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    local_198._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_198._0_8_ = psVar11->_M_string_length;
    local_1a8._0_8_ = &DAT_00000002;
    local_1a8._8_8_ = "-S";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_(&local_2b8,views_00);
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    local_198._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_198._0_8_ = psVar11->_M_string_length;
    local_1a8._0_8_ = &DAT_00000002;
    local_1a8._8_8_ = "-B";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_((string *)local_298,views_01);
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_1a8._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_1a8._0_8_ = psVar11->_M_string_length;
    local_198._0_8_ = local_2b8._M_string_length;
    local_198._8_8_ = local_2b8._M_dataplus._M_p;
    local_188 = (pointer)local_298._8_8_;
    local_180 = (element_type *)local_298._0_8_;
    ilist_00._M_len = 3;
    ilist_00._M_array = (iterator)local_1a8;
    cmMakeCommandLine((cmCustomCommandLine *)local_260,ilist_00);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>(&local_218,(cmCustomCommandLine *)local_260);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_260);
    psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_1a8._8_8_ = (psVar11->_M_dataplus)._M_p;
    local_1a8._0_8_ = psVar11->_M_string_length;
    local_198._0_8_ = 2;
    local_198._8_8_ = "-E";
    local_188 = (pointer)0x5;
    local_180 = (element_type *)0x6f6a5a;
    local_170 = (pointer)(this->StampFile)._M_dataplus._M_p;
    local_178 = (pointer)(this->StampFile)._M_string_length;
    ilist_01._M_len = 4;
    ilist_01._M_array = (iterator)local_1a8;
    cmMakeCommandLine((cmCustomCommandLine *)local_260,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>(&local_218,(cmCustomCommandLine *)local_260);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_260);
    std::make_unique<cmCustomCommand>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,CHECK_BUILD_SYSTEM_TARGET,(allocator<char> *)local_260);
    local_220._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)local_2c0._M_head_impl;
    local_2c0._M_head_impl = (cmCustomCommand *)0x0;
    local_240 = cmLocalGenerator::AddUtilityCommand
                          ((cmLocalGenerator *)
                           this_00._M_t.
                           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                           .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                           (string *)local_1a8,true,
                           (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                           &local_220);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_220);
    if ((cmCustomCommand *)local_1a8._0_8_ != (cmCustomCommand *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
    this_02.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         operator_new(0x8c0);
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)
               this_02.
               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
               super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,local_240,
               (cmLocalGenerator *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    local_228._M_t.
    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         (_Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)0x0;
    local_230._M_t.
    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         this_02.
         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
         super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
    cmLocalGenerator::AddGeneratorTarget
              ((cmLocalGenerator *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_230)
    ;
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_230)
    ;
    std::make_unique<cmCustomCommand>();
    uVar6 = local_1a8._0_8_;
    _Var5._M_head_impl = local_2c0._M_head_impl;
    local_1a8._0_8_ = (pointer)0x0;
    local_2c0._M_head_impl = (cmCustomCommand *)uVar6;
    if (_Var5._M_head_impl != (cmCustomCommand *)0x0) {
      cmCustomCommand::~cmCustomCommand(_Var5._M_head_impl);
      operator_delete(_Var5._M_head_impl,0x138);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_1a8);
    _Var5._M_head_impl = local_2c0._M_head_impl;
    pcVar3 = (this->StampFile)._M_dataplus._M_p;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar3,pcVar3 + (this->StampFile)._M_string_length);
    cmCustomCommand::SetOutputs(_Var5._M_head_impl,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_head_impl = local_2c0._M_head_impl;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_278);
    cmCustomCommand::SetDepends(_Var5._M_head_impl,&local_1c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    _Var5._M_head_impl = local_2c0._M_head_impl;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_1d8,&local_218);
    cmCustomCommand::SetCommandLines(_Var5._M_head_impl,(cmCustomCommandLines *)&local_1d8);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1d8);
    cmCustomCommand::SetComment(local_2c0._M_head_impl,"Checking Build System");
    cmCustomCommand::SetCMP0116Status(local_2c0._M_head_impl,NEW);
    cmCustomCommand::SetEscapeOldStyle(local_2c0._M_head_impl,false);
    (local_2c0._M_head_impl)->StdPipesUTF8 = true;
    local_238._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         local_2c0._M_head_impl;
    local_2c0._M_head_impl = (cmCustomCommand *)0x0;
    this_03 = cmLocalGenerator::AddCustomCommandToOutput
                        ((cmLocalGenerator *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,&local_238,
                         true);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_238)
    ;
    if (this_03 == (cmSourceFile *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Error adding rule for ",local_200);
      cmSystemTools::Error((string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      }
    }
    else {
      psVar11 = cmSourceFile::ResolveFullPath(this_03,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource
                ((cmGeneratorTarget *)
                 this_02.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,psVar11,false);
    }
    iVar10 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x2c])(this);
    if ((char)iVar10 != '\0') {
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"FOLDER","");
      cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
                ((string *)local_260,&this->super_cmGlobalGenerator);
      cmTarget::SetProperty(local_240,(string *)local_1a8,(string *)local_260);
      if ((pointer)local_260._0_8_ != (pointer)(local_260 + 0x10)) {
        operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
      }
      if ((undefined1 *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      }
    }
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_228)
    ;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_2c0);
    if ((element_type *)local_298._0_8_ != (element_type *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_218);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_278);
  }
  return !bVar8;
}

Assistant:

bool cmGlobalGhsMultiGenerator::AddCheckTarget()
{
  // Skip the target if no regeneration is to be done.
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return false;
  }

  // Get the generators.
  std::vector<std::unique_ptr<cmLocalGenerator>> const& generators =
    this->LocalGenerators;
  auto& lg =
    cm::static_reference_cast<cmLocalGhsMultiGenerator>(generators[0]);

  // The name of the output file for the custom command.
  this->StampFile = lg.GetBinaryDirectory() + std::string("/CMakeFiles/") +
    CHECK_BUILD_SYSTEM_TARGET;

  // Add a custom rule to re-run CMake if any input files changed.
  {
    // Collect the input files used to generate all targets in this
    // project.
    std::vector<std::string> listFiles;
    for (const auto& gen : generators) {
      cm::append(listFiles, gen->GetMakefile()->GetListFiles());
    }

    // Add the cache file.
    listFiles.push_back(cmStrCat(
      this->GetCMakeInstance()->GetHomeOutputDirectory(), "/CMakeCache.txt"));

    // Print not implemented warning.
    if (this->GetCMakeInstance()->DoWriteGlobVerifyTarget()) {
      std::ostringstream msg;
      msg << "Any pre-check scripts, such as those generated for file(GLOB "
             "CONFIGURE_DEPENDS), will not be run by gbuild.";
      this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                             msg.str());
    }

    // Sort the list of input files and remove duplicates.
    std::sort(listFiles.begin(), listFiles.end(), std::less<std::string>());
    auto newEnd = std::unique(listFiles.begin(), listFiles.end());
    listFiles.erase(newEnd, listFiles.end());

    // Create a rule to re-run CMake and create output file.
    cmCustomCommandLines commandLines;
    commandLines.emplace_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "rm", "-f",
                          this->StampFile }));
    std::string argS = cmStrCat("-S", lg.GetSourceDirectory());
    std::string argB = cmStrCat("-B", lg.GetBinaryDirectory());
    commandLines.emplace_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), argS, argB }));
    commandLines.emplace_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", "touch", this->StampFile }));

    /* Create the target(Exclude from ALL_BUILD).
     *
     * The build tool, currently, does not support rereading the project files
     * if they get updated. So do not run this target as part of ALL_BUILD.
     */
    auto cc = cm::make_unique<cmCustomCommand>();
    cmTarget* tgt =
      lg.AddUtilityCommand(CHECK_BUILD_SYSTEM_TARGET, true, std::move(cc));
    auto ptr = cm::make_unique<cmGeneratorTarget>(tgt, &lg);
    auto* gt = ptr.get();
    lg.AddGeneratorTarget(std::move(ptr));

    // Add the rule.
    cc = cm::make_unique<cmCustomCommand>();
    cc->SetOutputs(this->StampFile);
    cc->SetDepends(listFiles);
    cc->SetCommandLines(commandLines);
    cc->SetComment("Checking Build System");
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetStdPipesUTF8(true);

    if (cmSourceFile* file =
          lg.AddCustomCommandToOutput(std::move(cc), true)) {
      gt->AddSource(file->ResolveFullPath());
    } else {
      cmSystemTools::Error("Error adding rule for " + this->StampFile);
    }
    // Organize in the "predefined targets" folder:
    if (this->UseFolderProperty()) {
      tgt->SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
    }
  }

  return true;
}